

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O0

int material_lookup(char *name)

{
  bool bVar1;
  char *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  int flag;
  int local_20;
  int local_18;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    if (material_table[local_14].mat_name == (char *)0x0) {
      return -1;
    }
    if ((*in_RDI < 'A') || ('Z' < *in_RDI)) {
      local_18 = (int)*in_RDI;
    }
    else {
      local_18 = *in_RDI + 0x20;
    }
    if ((*material_table[local_14].mat_name < 'A') || ('Z' < *material_table[local_14].mat_name)) {
      local_20 = (int)*material_table[local_14].mat_name;
    }
    else {
      local_20 = *material_table[local_14].mat_name + 0x20;
    }
    if ((local_18 == local_20) && (bVar1 = str_prefix(in_stack_00000008,unaff_retaddr), !bVar1))
    break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int material_lookup(const char *name)
{
	int flag;

	for (flag = 0; material_table[flag].mat_name != nullptr; flag++)
	{
		if (LOWER(name[0]) == LOWER(material_table[flag].mat_name[0]) && !str_prefix(name, material_table[flag].mat_name))
			return flag;
	}

	return -1;
}